

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_field(LexState *ls,ExpDesc *v)

{
  undefined8 *in_RDI;
  ExpDesc key;
  FuncState *fs;
  FuncState *in_stack_ffffffffffffffc8;
  LexState *in_stack_ffffffffffffffd0;
  ExpDesc *in_stack_ffffffffffffffd8;
  ExpDesc *in_stack_ffffffffffffffe0;
  FuncState *fs_00;
  
  fs_00 = (FuncState *)*in_RDI;
  expr_toanyreg(in_stack_ffffffffffffffc8,(ExpDesc *)0x12eb0a);
  lj_lex_next((LexState *)0x12eb14);
  expr_str(in_stack_ffffffffffffffd0,(ExpDesc *)in_stack_ffffffffffffffc8);
  expr_index(fs_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void expr_field(LexState *ls, ExpDesc *v)
{
  FuncState *fs = ls->fs;
  ExpDesc key;
  expr_toanyreg(fs, v);
  lj_lex_next(ls);  /* Skip dot or colon. */
  expr_str(ls, &key);
  expr_index(fs, v, &key);
}